

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O0

int mk_http_range_parse(mk_http_request *sr)

{
  int iVar1;
  int iVar2;
  int pos_end;
  long lVar3;
  char *pcVar4;
  response_headers *sh;
  char *buffer;
  int len;
  int sep_pos;
  int eq_pos;
  mk_http_request *sr_local;
  
  if ((sr->range).data == (char *)0x0) {
    sr_local._4_4_ = -1;
  }
  else {
    iVar1 = mk_string_char_search((sr->range).data,0x3d,(int)(sr->range).len);
    if (iVar1 < 0) {
      sr_local._4_4_ = -1;
    }
    else {
      iVar2 = strncasecmp((sr->range).data,"Bytes",(long)iVar1);
      if (iVar2 == 0) {
        iVar2 = mk_string_char_search((sr->range).data,0x2d,(int)(sr->range).len);
        if (iVar2 < 0) {
          sr_local._4_4_ = -1;
        }
        else {
          pos_end = (int)(sr->range).len;
          if (iVar1 + 1 == iVar2) {
            (sr->headers).ranges[0] = -1;
            lVar3 = atol((sr->range).data + (long)iVar2 + 1);
            (sr->headers).ranges[1] = (int)lVar3;
            if ((sr->headers).ranges[1] < 1) {
              sr_local._4_4_ = -1;
            }
            else {
              (sr->headers).content_length = (long)(sr->headers).ranges[1];
              sr_local._4_4_ = 0;
            }
          }
          else if ((iVar1 + 1 == iVar2) || (pos_end <= iVar2 + 1)) {
            if ((iVar1 + 1 == iVar2) || (pos_end != iVar2 + 1)) {
              sr_local._4_4_ = -1;
            }
            else {
              pcVar4 = mk_string_copy_substr((sr->range).data,iVar1 + 1,pos_end);
              lVar3 = atol(pcVar4);
              (sr->headers).ranges[0] = (int)lVar3;
              mk_mem_free(pcVar4);
              (sr->headers).content_length =
                   (sr->headers).content_length - (long)(sr->headers).ranges[0];
              sr_local._4_4_ = 0;
            }
          }
          else {
            pcVar4 = mk_string_copy_substr((sr->range).data,iVar1 + 1,iVar2);
            lVar3 = atol(pcVar4);
            (sr->headers).ranges[0] = (int)lVar3;
            mk_mem_free(pcVar4);
            pcVar4 = mk_string_copy_substr((sr->range).data,iVar2 + 1,pos_end);
            lVar3 = atol(pcVar4);
            (sr->headers).ranges[1] = (int)lVar3;
            mk_mem_free(pcVar4);
            if (((sr->headers).ranges[1] < 0) || ((sr->headers).ranges[1] < (sr->headers).ranges[0])
               ) {
              sr_local._4_4_ = -1;
            }
            else {
              iVar1 = (sr->headers).ranges[1] - (sr->headers).ranges[0];
              if (iVar1 < 1) {
                iVar1 = -iVar1;
              }
              (sr->headers).content_length = (long)(iVar1 + 1);
              sr_local._4_4_ = 0;
            }
          }
        }
      }
      else {
        sr_local._4_4_ = -1;
      }
    }
  }
  return sr_local._4_4_;
}

Assistant:

static int mk_http_range_parse(struct mk_http_request *sr)
{
    int eq_pos, sep_pos, len;
    char *buffer = 0;
    struct response_headers *sh;

    if (!sr->range.data)
        return -1;

    if ((eq_pos = mk_string_char_search(sr->range.data, '=', sr->range.len)) < 0)
        return -1;

    if (strncasecmp(sr->range.data, "Bytes", eq_pos) != 0)
        return -1;

    if ((sep_pos = mk_string_char_search(sr->range.data, '-', sr->range.len)) < 0)
        return -1;

    len = sr->range.len;
    sh = &sr->headers;

    /* =-xxx */
    if (eq_pos + 1 == sep_pos) {
        sh->ranges[0] = -1;
        sh->ranges[1] = (unsigned long) atol(sr->range.data + sep_pos + 1);

        if (sh->ranges[1] <= 0) {
            return -1;
        }

        sh->content_length = sh->ranges[1];
        return 0;
    }

    /* =yyy-xxx */
    if ((eq_pos + 1 != sep_pos) && (len > sep_pos + 1)) {
        buffer = mk_string_copy_substr(sr->range.data, eq_pos + 1, sep_pos);
        sh->ranges[0] = (unsigned long) atol(buffer);
        mk_mem_free(buffer);

        buffer = mk_string_copy_substr(sr->range.data, sep_pos + 1, len);
        sh->ranges[1] = (unsigned long) atol(buffer);
        mk_mem_free(buffer);

        if (sh->ranges[1] < 0 || (sh->ranges[0] > sh->ranges[1])) {
            return -1;
        }

        sh->content_length = abs(sh->ranges[1] - sh->ranges[0]) + 1;
        return 0;
    }
    /* =yyy- */
    if ((eq_pos + 1 != sep_pos) && (len == sep_pos + 1)) {
        buffer = mk_string_copy_substr(sr->range.data, eq_pos + 1, len);
        sr->headers.ranges[0] = (unsigned long) atol(buffer);
        mk_mem_free(buffer);

        sh->content_length = (sh->content_length - sh->ranges[0]);
        return 0;
    }

    return -1;
}